

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_striped_sse2_128_32.c
# Opt level: O3

parasail_result_t *
parasail_sw_table_striped_profile_sse2_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  int *piVar1;
  uint *puVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  __m128i *palVar5;
  int iVar6;
  int iVar7;
  parasail_result_t *result;
  __m128i *b;
  __m128i *palVar8;
  __m128i *palVar9;
  __m128i *b_00;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  long lVar13;
  ulong size;
  __m128i *ptr;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  uint uVar18;
  int iVar19;
  long lVar20;
  bool bVar21;
  undefined1 auVar22 [16];
  uint uVar23;
  ulong uVar25;
  int iVar31;
  undefined1 auVar26 [16];
  int iVar30;
  int iVar32;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int iVar37;
  int iVar38;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  int iVar39;
  undefined1 auVar36 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  uint uVar50;
  uint uVar51;
  uint uVar52;
  uint uVar53;
  uint uVar54;
  uint uVar55;
  uint uVar56;
  uint uVar57;
  uint uVar58;
  uint uVar59;
  uint uVar60;
  __m128i c;
  __m128i c_00;
  uint local_c4;
  ulong local_b0;
  ulong local_a8;
  size_t len;
  uint uVar24;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sw_table_striped_profile_sse2_128_32_cold_8();
  }
  else {
    pvVar3 = (profile->profile32).score;
    if (pvVar3 == (void *)0x0) {
      parasail_sw_table_striped_profile_sse2_128_32_cold_7();
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        parasail_sw_table_striped_profile_sse2_128_32_cold_6();
      }
      else {
        uVar16 = profile->s1Len;
        if ((int)uVar16 < 1) {
          parasail_sw_table_striped_profile_sse2_128_32_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_table_striped_profile_sse2_128_32_cold_4();
        }
        else {
          local_b0 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_sw_table_striped_profile_sse2_128_32_cold_3();
          }
          else if (open < 0) {
            parasail_sw_table_striped_profile_sse2_128_32_cold_2();
          }
          else if (gap < 0) {
            parasail_sw_table_striped_profile_sse2_128_32_cold_1();
          }
          else {
            uVar12 = (ulong)uVar16 + 3;
            uVar11 = 0x7ffffffe - ppVar4->max;
            len = (size_t)uVar11;
            uVar18 = (uint)uVar12 & 0x7ffffffc;
            result = parasail_result_new_table1(uVar18,s2Len);
            if (result != (parasail_result_t *)0x0) {
              size = uVar12 >> 2;
              result->flag = result->flag | 0x4420804;
              b = parasail_memalign___m128i(0x10,size);
              palVar8 = parasail_memalign___m128i(0x10,size);
              palVar9 = parasail_memalign___m128i(0x10,size);
              b_00 = parasail_memalign___m128i(0x10,size);
              auVar22._0_4_ = -(uint)((int)b == 0 && (int)((ulong)b >> 0x20) == 0);
              auVar22._4_4_ = -(uint)((int)palVar8 == 0 && (int)((ulong)palVar8 >> 0x20) == 0);
              auVar22._8_4_ = -(uint)((int)palVar9 == 0 && (int)((ulong)palVar9 >> 0x20) == 0);
              auVar22._12_4_ = -(uint)((int)b_00 == 0 && (int)((ulong)b_00 >> 0x20) == 0);
              iVar6 = movmskps((int)b_00,auVar22);
              if (iVar6 == 0) {
                local_a8 = 0;
                c[1] = extraout_RDX;
                c[0] = size;
                parasail_memset___m128i(b,c,len);
                c_00[1] = extraout_RDX_00;
                c_00[0] = size;
                parasail_memset___m128i(b_00,c_00,len);
                iVar6 = (int)size;
                lVar13 = size * local_b0;
                local_c4 = 0xc0000000;
                lVar14 = 0;
                uVar15 = 0;
                auVar22 = _DAT_00904fd0;
                auVar29 = _DAT_00904fd0;
                do {
                  ptr = b;
                  iVar7 = ppVar4->mapper[(byte)s2[uVar15]];
                  palVar5 = palVar9;
                  b = palVar8;
                  if ((int)local_a8 == (int)uVar15 + -2) {
                    palVar5 = palVar8;
                    b = palVar9;
                  }
                  palVar9 = palVar5;
                  palVar8 = ptr + (iVar6 - 1);
                  iVar30 = (int)(*palVar8)[0];
                  iVar31 = *(int *)((long)*palVar8 + 4);
                  iVar32 = (int)(*palVar8)[1];
                  iVar19 = 0;
                  auVar26 = ZEXT816(0);
                  lVar10 = 0;
                  lVar17 = lVar14;
                  do {
                    piVar1 = (int *)((long)pvVar3 + lVar10 + (long)iVar7 * size * 0x10);
                    auVar40._0_4_ = iVar19 + *piVar1;
                    auVar40._4_4_ = iVar30 + piVar1[1];
                    auVar40._8_4_ = iVar31 + piVar1[2];
                    auVar40._12_4_ = iVar32 + piVar1[3];
                    auVar35 = *(undefined1 (*) [16])((long)*b_00 + lVar10);
                    auVar45._0_4_ = -(uint)(auVar35._0_4_ < auVar40._0_4_);
                    auVar45._4_4_ = -(uint)(auVar35._4_4_ < auVar40._4_4_);
                    auVar45._8_4_ = -(uint)(auVar35._8_4_ < auVar40._8_4_);
                    auVar45._12_4_ = -(uint)(auVar35._12_4_ < auVar40._12_4_);
                    auVar46 = ~auVar45 & auVar35 | auVar40 & auVar45;
                    auVar49._0_4_ = -(uint)(auVar26._0_4_ < auVar46._0_4_);
                    auVar49._4_4_ = -(uint)(auVar26._4_4_ < auVar46._4_4_);
                    auVar49._8_4_ = -(uint)(auVar26._8_4_ < auVar46._8_4_);
                    auVar49._12_4_ = -(uint)(auVar26._12_4_ < auVar46._12_4_);
                    auVar46 = ~auVar49 & auVar26 | auVar46 & auVar49;
                    auVar41._0_4_ = -(uint)(0 < auVar46._0_4_);
                    auVar41._4_4_ = -(uint)(0 < auVar46._4_4_);
                    auVar41._8_4_ = -(uint)(0 < auVar46._8_4_);
                    auVar41._12_4_ = -(uint)(0 < auVar46._12_4_);
                    auVar41 = auVar41 & auVar46;
                    *(undefined1 (*) [16])((long)*b + lVar10) = auVar41;
                    piVar1 = ((result->field_4).rowcols)->score_row;
                    iVar19 = auVar41._0_4_;
                    *(int *)((long)piVar1 + lVar17) = iVar19;
                    iVar30 = auVar41._4_4_;
                    iVar31 = auVar41._8_4_;
                    iVar32 = auVar41._12_4_;
                    *(int *)((long)piVar1 + lVar13 * 4 + lVar17) = iVar30;
                    *(int *)((long)piVar1 + lVar13 * 8 + lVar17) = iVar31;
                    *(int *)((long)piVar1 + lVar13 * 0xc + lVar17) = iVar32;
                    auVar47._0_4_ = -(uint)(auVar22._0_4_ < iVar19);
                    auVar47._4_4_ = -(uint)(auVar22._4_4_ < iVar30);
                    auVar47._8_4_ = -(uint)(auVar22._8_4_ < iVar31);
                    auVar47._12_4_ = -(uint)(auVar22._12_4_ < iVar32);
                    auVar22 = ~auVar47 & auVar22 | auVar41 & auVar47;
                    auVar42._0_4_ = iVar19 - open;
                    auVar42._4_4_ = iVar30 - open;
                    auVar42._8_4_ = iVar31 - open;
                    auVar42._12_4_ = iVar32 - open;
                    auVar33._0_4_ = auVar35._0_4_ - gap;
                    auVar33._4_4_ = auVar35._4_4_ - gap;
                    auVar33._8_4_ = auVar35._8_4_ - gap;
                    auVar33._12_4_ = auVar35._12_4_ - gap;
                    auVar48._0_4_ = -(uint)(auVar42._0_4_ < auVar33._0_4_);
                    auVar48._4_4_ = -(uint)(auVar42._4_4_ < auVar33._4_4_);
                    auVar48._8_4_ = -(uint)(auVar42._8_4_ < auVar33._8_4_);
                    auVar48._12_4_ = -(uint)(auVar42._12_4_ < auVar33._12_4_);
                    *(undefined1 (*) [16])((long)*b_00 + lVar10) =
                         ~auVar48 & auVar42 | auVar33 & auVar48;
                    auVar35._0_4_ = auVar26._0_4_ - gap;
                    auVar35._4_4_ = auVar26._4_4_ - gap;
                    auVar35._8_4_ = auVar26._8_4_ - gap;
                    auVar35._12_4_ = auVar26._12_4_ - gap;
                    auVar46._0_4_ = -(uint)(auVar42._0_4_ < auVar35._0_4_);
                    auVar46._4_4_ = -(uint)(auVar42._4_4_ < auVar35._4_4_);
                    auVar46._8_4_ = -(uint)(auVar42._8_4_ < auVar35._8_4_);
                    auVar46._12_4_ = -(uint)(auVar42._12_4_ < auVar35._12_4_);
                    auVar26 = ~auVar46 & auVar42 | auVar35 & auVar46;
                    piVar1 = (int *)((long)*ptr + lVar10);
                    iVar19 = *piVar1;
                    iVar30 = piVar1[1];
                    iVar31 = piVar1[2];
                    iVar32 = piVar1[3];
                    lVar10 = lVar10 + 0x10;
                    lVar17 = lVar17 + local_b0 * 4;
                  } while (size << 4 != lVar10);
                  iVar7 = 0;
                  do {
                    lVar17 = auVar26._8_8_;
                    uVar25 = auVar26._0_8_;
                    auVar26._0_8_ = uVar25 << 0x20;
                    auVar26._8_8_ = lVar17 << 0x20 | uVar25 >> 0x20;
                    lVar10 = 0;
                    lVar17 = lVar14;
                    do {
                      auVar35 = *(undefined1 (*) [16])((long)*b + lVar10);
                      auVar34._0_4_ = -(uint)(auVar26._0_4_ < auVar35._0_4_);
                      iVar30 = auVar26._4_4_;
                      auVar34._4_4_ = -(uint)(iVar30 < auVar35._4_4_);
                      iVar31 = auVar26._8_4_;
                      auVar34._8_4_ = -(uint)(iVar31 < auVar35._8_4_);
                      iVar32 = auVar26._12_4_;
                      auVar34._12_4_ = -(uint)(iVar32 < auVar35._12_4_);
                      auVar35 = ~auVar34 & auVar26 | auVar35 & auVar34;
                      *(undefined1 (*) [16])((long)*b + lVar10) = auVar35;
                      piVar1 = ((result->field_4).rowcols)->score_row;
                      iVar19 = auVar35._0_4_;
                      *(int *)((long)piVar1 + lVar17) = iVar19;
                      lVar20 = (long)piVar1 + lVar17;
                      iVar37 = auVar35._4_4_;
                      iVar38 = auVar35._8_4_;
                      iVar39 = auVar35._12_4_;
                      *(int *)(lVar13 * 4 + lVar20) = iVar37;
                      *(int *)(lVar13 * 8 + lVar20) = iVar38;
                      *(int *)(lVar13 * 0xc + lVar20) = iVar39;
                      auVar43._0_4_ = -(uint)(auVar22._0_4_ < iVar19);
                      auVar43._4_4_ = -(uint)(auVar22._4_4_ < iVar37);
                      auVar43._8_4_ = -(uint)(auVar22._8_4_ < iVar38);
                      auVar43._12_4_ = -(uint)(auVar22._12_4_ < iVar39);
                      auVar22 = ~auVar43 & auVar22 | auVar35 & auVar43;
                      auVar26._0_4_ = auVar26._0_4_ - gap;
                      auVar26._4_4_ = iVar30 - gap;
                      auVar26._8_4_ = iVar31 - gap;
                      auVar26._12_4_ = iVar32 - gap;
                      auVar44._0_4_ = -(uint)(iVar19 - open < auVar26._0_4_);
                      auVar44._4_4_ = -(uint)(iVar37 - open < auVar26._4_4_);
                      auVar44._8_4_ = -(uint)(iVar38 - open < auVar26._8_4_);
                      auVar44._12_4_ = -(uint)(iVar39 - open < auVar26._12_4_);
                      iVar19 = movmskps((int)lVar20,auVar44);
                      if (iVar19 == 0) goto LAB_005c35c9;
                      lVar10 = lVar10 + 0x10;
                      lVar17 = lVar17 + local_b0 * 4;
                    } while (size << 4 != lVar10);
                    iVar7 = iVar7 + 1;
                  } while (iVar7 != 4);
LAB_005c35c9:
                  auVar27._0_4_ = -(uint)(auVar29._0_4_ < auVar22._0_4_);
                  auVar27._4_4_ = -(uint)(auVar29._4_4_ < auVar22._4_4_);
                  iVar19 = auVar22._8_4_;
                  iVar30 = auVar22._12_4_;
                  auVar27._8_4_ = -(uint)(auVar29._8_4_ < iVar19);
                  auVar27._12_4_ = -(uint)(auVar29._12_4_ < iVar30);
                  iVar7 = movmskps(iVar7,auVar27);
                  if (iVar7 != 0) {
                    auVar28._0_4_ = -(uint)(iVar19 < auVar22._0_4_);
                    auVar28._4_4_ = -(uint)(iVar30 < auVar22._4_4_);
                    auVar28._8_4_ = -(uint)(0 < iVar19);
                    auVar28._12_4_ = -(uint)(0 < iVar30);
                    auVar29 = ~auVar28 & auVar22 >> 0x40 | auVar22 & auVar28;
                    uVar24 = auVar29._0_4_;
                    uVar50 = auVar29._4_4_;
                    uVar23 = -(uint)((int)uVar50 < (int)uVar24);
                    local_c4 = ~uVar23 & uVar50 | uVar24 & uVar23;
                    if ((int)uVar11 < (int)local_c4) {
                      *(byte *)&result->flag = (byte)result->flag | 0x40;
                      local_b0 = uVar15;
                      break;
                    }
                    auVar29._4_4_ = local_c4;
                    auVar29._0_4_ = local_c4;
                    auVar29._8_4_ = local_c4;
                    auVar29._12_4_ = local_c4;
                    local_a8 = uVar15 & 0xffffffff;
                  }
                  uVar15 = uVar15 + 1;
                  lVar14 = lVar14 + 4;
                  palVar8 = ptr;
                } while (uVar15 != local_b0);
                if (local_c4 == 0x7fffffff) {
                  *(byte *)&result->flag = (byte)result->flag | 0x40;
                }
                iVar7 = parasail_result_is_saturated(result);
                palVar8 = palVar9;
                if (iVar7 == 0) {
                  palVar5 = ptr;
                  if ((int)local_a8 == (int)local_b0 + -2) {
                    palVar8 = ptr;
                    palVar5 = palVar9;
                  }
                  if ((int)local_a8 == (int)local_b0 + -1) {
                    palVar8 = b;
                    b = palVar9;
                    palVar5 = ptr;
                  }
                  ptr = palVar5;
                  uVar16 = uVar16 - 1;
                  bVar21 = (uVar12 & 0x7ffffffc) == 0;
                  if (!bVar21) {
                    if (bVar21) {
                      uVar12 = 0;
                      do {
                        uVar11 = (uint)(uVar12 >> 2) & 0x3fffffff;
                        if ((int)uVar16 <= (int)uVar11) {
                          uVar11 = uVar16;
                        }
                        if (*(uint *)((long)*palVar8 + uVar12 * 4) != local_c4) {
                          uVar11 = uVar16;
                        }
                        uVar16 = uVar11;
                        uVar12 = uVar12 + 1;
                      } while ((int)uVar12 != 0);
                    }
                    else {
                      uVar12 = 0;
                      auVar36 = _DAT_00904a60;
                      uVar11 = uVar16;
                      uVar24 = uVar16;
                      uVar23 = uVar16;
                      do {
                        puVar2 = (uint *)((long)*palVar8 + uVar12 * 4);
                        uVar51 = auVar36._4_4_;
                        uVar53 = auVar36._8_4_;
                        uVar55 = auVar36._12_4_;
                        auVar22 = auVar36 & _DAT_00904a70;
                        uVar57 = auVar22._0_4_ * iVar6 + (auVar36._0_4_ >> 2);
                        uVar58 = auVar22._4_4_ * iVar6 + (uVar51 >> 2);
                        uVar59 = (int)((auVar22._8_8_ & 0xffffffff) * size) + (uVar53 >> 2);
                        uVar60 = auVar22._12_4_ * iVar6 + (uVar55 >> 2);
                        uVar50 = -(uint)((int)uVar57 < (int)uVar16);
                        uVar52 = -(uint)((int)uVar58 < (int)uVar11);
                        uVar54 = -(uint)((int)uVar59 < (int)uVar24);
                        uVar56 = -(uint)((int)uVar60 < (int)uVar23);
                        uVar16 = ~-(uint)(*puVar2 == local_c4) & uVar16 |
                                 (~uVar50 & uVar16 | uVar57 & uVar50) & -(uint)(*puVar2 == local_c4)
                        ;
                        uVar11 = ~-(uint)(puVar2[1] == local_c4) & uVar11 |
                                 (~uVar52 & uVar11 | uVar58 & uVar52) &
                                 -(uint)(puVar2[1] == local_c4);
                        uVar24 = ~-(uint)(puVar2[2] == local_c4) & uVar24 |
                                 (~uVar54 & uVar24 | uVar59 & uVar54) &
                                 -(uint)(puVar2[2] == local_c4);
                        uVar23 = ~-(uint)(puVar2[3] == local_c4) & uVar23 |
                                 (~uVar56 & uVar23 | uVar60 & uVar56) &
                                 -(uint)(puVar2[3] == local_c4);
                        uVar12 = uVar12 + 4;
                        auVar36._0_4_ = auVar36._0_4_ + 4;
                        auVar36._4_4_ = uVar51 + 4;
                        auVar36._8_4_ = uVar53 + 4;
                        auVar36._12_4_ = uVar55 + 4;
                      } while (uVar18 != uVar12);
                      uVar18 = ~-(uint)((int)uVar16 < (int)uVar24) & uVar24 |
                               uVar16 & -(uint)((int)uVar16 < (int)uVar24);
                      uVar11 = ~-(uint)((int)uVar11 < (int)uVar23) & uVar23 |
                               uVar11 & -(uint)((int)uVar11 < (int)uVar23);
                      uVar16 = -(uint)((int)uVar18 < (int)uVar11);
                      uVar16 = ~uVar16 & uVar11 | uVar18 & uVar16;
                    }
                  }
                }
                else {
                  local_a8._0_4_ = 0;
                  local_c4 = 0x7fffffff;
                  uVar16 = 0;
                }
                result->score = local_c4;
                result->end_query = uVar16;
                result->end_ref = (int)local_a8;
                parasail_free(b_00);
                parasail_free(palVar8);
                parasail_free(ptr);
                parasail_free(b);
                return result;
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvE = NULL;
    __m128i vGapO;
    __m128i vGapE;
    __m128i vZero;
    __m128i vNegInf;
    int32_t score = 0;
    __m128i vMaxH;
    __m128i vMaxHUnit;
    int32_t maxp = 0;
    /*int32_t stop = 0;*/
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile = (__m128i*)profile->profile32.score;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    vZero = _mm_setzero_si128();
    vNegInf = _mm_set1_epi32(NEG_INF);
    score = NEG_INF;
    vMaxH = vNegInf;
    vMaxHUnit = vNegInf;
    maxp = INT32_MAX - (int32_t)(matrix->max+1);
    /*stop = profile->stop == INT32_MAX ?  INT32_MAX : (int32_t)profile->stop;*/

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad =  parasail_memalign___m128i(16, segLen);
    pvHMax = parasail_memalign___m128i(16, segLen);
    pvE = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMax) return NULL;
    if (!pvE) return NULL;

    /* initialize H and E */
    parasail_memset___m128i(pvHStore, vZero, segLen);
    parasail_memset___m128i(pvE, _mm_set1_epi32(-open), segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vF;
        __m128i vH;
        const __m128i* vP = NULL;
        __m128i* pv = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop. */
        vF = vZero;

        /* load final segment of pvHStore and shift left by 4 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 4);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }
        else {
            /* Swap the 2 H buffers. */
            pv = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_add_epi32(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi32_rpl(vH, vE);
            vH = _mm_max_epi32_rpl(vH, vF);
            vH = _mm_max_epi32_rpl(vH, vZero);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vMaxH = _mm_max_epi32_rpl(vH, vMaxH);

            /* Update vE value. */
            vH = _mm_sub_epi32(vH, vGapO);
            vE = _mm_sub_epi32(vE, vGapE);
            vE = _mm_max_epi32_rpl(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_sub_epi32(vF, vGapE);
            vF = _mm_max_epi32_rpl(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            vF = _mm_slli_si128(vF, 4);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi32_rpl(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vMaxH = _mm_max_epi32_rpl(vH, vMaxH);
                vH = _mm_sub_epi32(vH, vGapO);
                vF = _mm_sub_epi32(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi32(vF, vH))) goto end;
                /*vF = _mm_max_epi32_rpl(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
            }
            result->rowcols->score_row[j] = (int32_t) _mm_extract_epi32_rpl (vH, 3);
        }
#endif

        {
            __m128i vCompare = _mm_cmpgt_epi32(vMaxH, vMaxHUnit);
            if (_mm_movemask_epi8(vCompare)) {
                score = _mm_hmax_epi32_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm_set1_epi32(score);
                end_ref = j;
            }
        }

        /*if (score == stop) break;*/
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    if (score == INT32_MAX) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = INT32_MAX;
        end_query = 0;
        end_ref = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            __m128i *pv = pvHMax;
            pvHMax = pvHStore;
            pvHStore = pv;
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            __m128i *pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pv;
        }
        /* Trace the alignment ending position on read. */
        {
            int32_t *t = (int32_t*)pvHMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len - 1;
            for (i = 0; i<column_len; ++i, ++t) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                    }
                }
            }
        }
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvE);
    parasail_free(pvHMax);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}